

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Bitmap.cxx
# Opt level: O0

int __thiscall
Fl_Bitmap::start(Fl_Bitmap *this,int XP,int YP,int WP,int HP,int *cx,int *cy,int *X,int *Y,int *W,
                int *H)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Bitmask FVar4;
  int *cx_local;
  int HP_local;
  int WP_local;
  int YP_local;
  int XP_local;
  Fl_Bitmap *this_local;
  
  if (this->array == (uchar *)0x0) {
    Fl_Image::draw_empty(&this->super_Fl_Image,XP,YP);
    this_local._4_4_ = 1;
  }
  else {
    fl_clip_box(XP,YP,WP,HP,X,Y,W,H);
    *cx = (*X - XP) + *cx;
    *cy = (*Y - YP) + *cy;
    if (*cx < 0) {
      *W = *cx + *W;
      *X = *X - *cx;
      *cx = 0;
    }
    iVar2 = *cx;
    iVar3 = *W;
    iVar1 = Fl_Image::w(&this->super_Fl_Image);
    if (iVar1 < iVar2 + iVar3) {
      iVar2 = Fl_Image::w(&this->super_Fl_Image);
      *W = iVar2 - *cx;
    }
    if (*W < 1) {
      this_local._4_4_ = 1;
    }
    else {
      if (*cy < 0) {
        *H = *cy + *H;
        *Y = *Y - *cy;
        *cy = 0;
      }
      iVar2 = *cy;
      iVar3 = *H;
      iVar1 = Fl_Image::h(&this->super_Fl_Image);
      if (iVar1 < iVar2 + iVar3) {
        iVar2 = Fl_Image::h(&this->super_Fl_Image);
        *H = iVar2 - *cy;
      }
      if (*H < 1) {
        this_local._4_4_ = 1;
      }
      else {
        if (this->id_ == 0) {
          iVar2 = Fl_Image::w(&this->super_Fl_Image);
          iVar3 = Fl_Image::h(&this->super_Fl_Image);
          FVar4 = fl_create_bitmask(iVar2,iVar3,this->array);
          this->id_ = (uint)FVar4;
        }
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Bitmap::start(int XP, int YP, int WP, int HP, int &cx, int &cy,
		 int &X, int &Y, int &W, int &H)
{
  if (!array) {
    draw_empty(XP, YP);
    return 1;
  }
  // account for current clip region (faster on Irix):
  fl_clip_box(XP,YP,WP,HP,X,Y,W,H);
  cx += X-XP; cy += Y-YP;
  // clip the box down to the size of image, quit if empty:
  if (cx < 0) {W += cx; X -= cx; cx = 0;}
  if (cx+W > w()) W = w()-cx;
  if (W <= 0) return 1;
  if (cy < 0) {H += cy; Y -= cy; cy = 0;}
  if (cy+H > h()) H = h()-cy;
  if (H <= 0) return 1;
#if defined(WIN32)
  if (!id_) id_ = fl_create_bitmap(w(), h(), array);
#else
  if (!id_) id_ = fl_create_bitmask(w(), h(), array);
#endif
  return 0;
}